

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O3

void tchecker::dbm::zero(db_t *dbm,clock_id_t dim)

{
  bool bVar1;
  long lVar2;
  clock_id_t i;
  clock_id_t cVar3;
  ulong uVar4;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x48,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
  }
  if (dim != 0) {
    lVar2 = 0;
    cVar3 = 0;
    do {
      uVar4 = 0;
      do {
        dbm[(uint)((int)lVar2 + (int)uVar4)] = (db_t)0x1;
        uVar4 = uVar4 + 1;
      } while (dim != uVar4);
      cVar3 = cVar3 + 1;
      lVar2 = lVar2 + (ulong)dim;
    } while (cVar3 != dim);
    bVar1 = is_consistent(dbm,dim);
    if (bVar1) {
      bVar1 = is_tight(dbm,dim);
      if (bVar1) {
        return;
      }
      __assert_fail("tchecker::dbm::is_tight(dbm, dim)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                    ,0x4e,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
    }
    __assert_fail("tchecker::dbm::is_consistent(dbm, dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x4d,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
  }
  __assert_fail("dim >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,0x49,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
}

Assistant:

void zero(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  for (tchecker::clock_id_t i = 0; i < dim; ++i)
    for (tchecker::clock_id_t j = 0; j < dim; ++j)
      DBM(i, j) = tchecker::dbm::LE_ZERO;
  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));
}